

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O2

void __thiscall QuickImpl::~QuickImpl(QuickImpl *this)

{
  (this->super_Quick)._vptr_Quick = (_func_int **)&PTR_ConnectToServer_00137898;
  LogWrapper::Close(&g_quic_log);
  (*(((this->_paced_thread)._M_t.
      super___uniq_ptr_impl<dd::ProcessThread,_std::default_delete<dd::ProcessThread>_>._M_t.
      super__Tuple_impl<0UL,_dd::ProcessThread_*,_std::default_delete<dd::ProcessThread>_>.
      super__Head_base<0UL,_dd::ProcessThread_*,_false>._M_head_impl)->super_TaskQueueBase).
    _vptr_TaskQueueBase[6])();
  AckThread::StopThread
            ((this->_ack_thread_impl)._M_t.
             super___uniq_ptr_impl<AckThread,_std::default_delete<AckThread>_>._M_t.
             super__Tuple_impl<0UL,_AckThread_*,_std::default_delete<AckThread>_>.
             super__Head_base<0UL,_AckThread_*,_false>._M_head_impl);
  std::thread::join();
  std::unique_ptr<AckThread,_std::default_delete<AckThread>_>::~unique_ptr(&this->_ack_thread_impl);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&this->_ack_thread);
  pthread_mutex_destroy((pthread_mutex_t *)&this->_quick_lock);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->_connections)._M_h);
  std::unique_ptr<UdpSocket,_std::default_delete<UdpSocket>_>::~unique_ptr(&this->_udp_socket);
  std::unique_ptr<PacketReader,_std::default_delete<PacketReader>_>::~unique_ptr
            (&this->_packet_reader);
  std::unique_ptr<dd::ProcessThread,_std::default_delete<dd::ProcessThread>_>::~unique_ptr
            (&this->_paced_thread);
  dd::TaskQueue::~TaskQueue(&this->_task_queue);
  std::unique_ptr<dd::TaskQueueFactory,_std::default_delete<dd::TaskQueueFactory>_>::~unique_ptr
            (&this->_task_queue_factory);
  return;
}

Assistant:

QuickImpl::~QuickImpl()
{
	g_quic_log.Close();
	_paced_thread->Stop();

	_ack_thread_impl->StopThread();
	_ack_thread->join();
}